

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::processDirtyItemsRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool dirtyAncestorContainsChildren,
          qreal parentOpacity)

{
  undefined1 *puVar1;
  long lVar2;
  QGraphicsScene *this_00;
  long lVar3;
  QGraphicsView **ppQVar4;
  QGraphicsViewPrivate *this_01;
  QGraphicsView *this_02;
  QGraphicsItem *pQVar5;
  ulong uVar6;
  QGraphicsItem **ppQVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  QRect *this_03;
  qint64 qVar13;
  qint64 qVar14;
  QGraphicsItemPrivate *pQVar15;
  undefined4 uVar16;
  long lVar17;
  QTransform *pQVar18;
  qreal *pqVar19;
  QRectF *pQVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long in_FS_OFFSET;
  bool bVar24;
  bool bVar25;
  byte bVar26;
  ulong uVar27;
  qreal parentOpacity_00;
  qreal qVar28;
  undefined1 auVar29 [16];
  ulong local_158;
  QRectF local_118;
  QRectF local_f8;
  QTransform local_d8;
  QTransform xform;
  
  bVar26 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar15 = (item->d_ptr).d;
  uVar22 = *(ulong *)&pQVar15->field_0x160;
  if ((uVar22 & 0x6000000) == 0) {
LAB_005922a5:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      bVar25 = false;
LAB_005922e6:
      resetDirtyItem(this,item,bVar25);
      return;
    }
    goto LAB_00592bd7;
  }
  if ((uVar22 & 0x200000000000020) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      bVar25 = true;
      goto LAB_005922e6;
    }
    goto LAB_00592bd7;
  }
  this_00 = *(QGraphicsScene **)&this->field_0x8;
  lVar3 = (pQVar15->children).d.size;
  bVar25 = true;
  if ((uVar22 >> 0x2a & 1) != 0) {
    if (lVar3 == 0) goto LAB_005922a5;
    bVar25 = pQVar15->graphicsEffect != (QGraphicsEffect *)0x0;
  }
  parentOpacity_00 = QGraphicsItemPrivate::combineOpacityFromParent(pQVar15,parentOpacity);
  pQVar15 = (item->d_ptr).d;
  uVar22 = *(ulong *)&pQVar15->field_0x160;
  bVar24 = (uVar22 >> 0x3a & 1) == 0;
  if (parentOpacity_00 < 0.001 && bVar24) {
    if ((lVar3 == 0) || (bVar10 = QGraphicsItemPrivate::childrenCombineOpacity(pQVar15), bVar10)) {
      bVar25 = lVar3 != 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) goto LAB_005922e6;
      goto LAB_00592bd7;
    }
    pQVar15 = (item->d_ptr).d;
    uVar22 = *(ulong *)&pQVar15->field_0x160;
  }
  local_158 = uVar22;
  if ((uVar22 & 0x20002000040000) == 0x20000000000000) {
    (*pQVar15->_vptr_QGraphicsItemPrivate[2])();
    pQVar15 = (item->d_ptr).d;
    local_158 = *(ulong *)&pQVar15->field_0x160;
  }
  if ((bool)((parentOpacity_00 < 0.001 && bVar24) | bVar25 ^ 1U) || dirtyAncestorContainsChildren) {
    *(ulong *)&pQVar15->field_0x160 = local_158 & 0xfffffffffdffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
    if (parentOpacity_00 < 0.001 && bVar24 || (bool)(bVar25 ^ 1U)) {
      puVar1 = &((item->d_ptr).d)->field_0x160;
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
    }
  }
  if (((this->field_0xb8 & 1) == 0) &&
     (uVar27 = *(ulong *)&((item->d_ptr).d)->field_0x160, (~uVar27 & 0x40000000000020) == 0)) {
    if ((uVar27 >> 0x3e & 1) == 0) {
      (*item->_vptr_QGraphicsItem[3])(&local_d8,item);
      QTransform::mapRect((QRectF *)&xform);
    }
    else {
      (*item->_vptr_QGraphicsItem[3])(&local_d8,item);
      pQVar15 = (item->d_ptr).d;
      xform.m_matrix[0][0] = (pQVar15->sceneTransform).m_matrix[2][0] + local_d8.m_matrix[0][0];
      xform.m_matrix[0][1] = (pQVar15->sceneTransform).m_matrix[2][1] + local_d8.m_matrix[0][1];
      xform.m_matrix[0][2] = local_d8.m_matrix[0][2];
      xform.m_matrix[1][0] = local_d8.m_matrix[1][0];
    }
    QRectF::operator|=(&this->growingItemsBoundingRect,(QRectF *)&xform);
  }
  if ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000002000000) != 0) {
    if ((this->views).d.size == 0) {
      local_f8.w._0_4_ = 0xffffffff;
      local_f8.w._4_4_ = 0xffffffff;
      local_f8.h._0_4_ = 0xffffffff;
      local_f8.h._4_4_ = 0xffffffff;
      local_f8.xp._0_4_ = 0xffffffff;
      local_f8.xp._4_4_ = 0xffffffff;
      local_f8.yp._0_4_ = 0xffffffff;
      local_f8.yp._4_4_ = 0xffffffff;
      adjustedItemEffectiveBoundingRect(&local_f8,item);
      if ((uVar22 & 0x2000040000) == 0) goto LAB_005924f3;
    }
    else {
      cVar11 = QObjectPrivate::isSignalConnected((uint)this,SUB41(this->changedSignalIndex,0));
      local_f8.w._0_4_ = 0xffffffff;
      local_f8.w._4_4_ = 0xffffffff;
      local_f8.h._0_4_ = 0xffffffff;
      local_f8.h._4_4_ = 0xffffffff;
      local_f8.xp._0_4_ = 0xffffffff;
      local_f8.xp._4_4_ = 0xffffffff;
      local_f8.yp._0_4_ = 0xffffffff;
      local_f8.yp._4_4_ = 0xffffffff;
      adjustedItemEffectiveBoundingRect(&local_f8,item);
      if (((uVar22 & 0x2000040000) == 0) && (cVar11 != '\0')) {
LAB_005924f3:
        qVar28 = QGraphicsItem::boundingRegionGranularity(item);
        uVar27 = -(ulong)(qVar28 < -qVar28);
        if ((double)(~uVar27 & (ulong)qVar28 | (ulong)-qVar28 & uVar27) <= 1e-12) {
          pQVar15 = (item->d_ptr).d;
          if ((pQVar15->field_0x167 & 0x40) == 0) {
            xform.m_matrix[0][2] = -NAN;
            xform.m_matrix[1][0] = -NAN;
            xform.m_matrix[0][0] = -NAN;
            xform.m_matrix[0][1] = -NAN;
            QTransform::mapRect((QRectF *)&xform);
            if ((xform.m_matrix[0][2] <= 0.0) || (xform.m_matrix[1][0] <= 0.0)) goto LAB_005928e0;
          }
          else {
            xform.m_matrix[0][0] =
                 (pQVar15->sceneTransform).m_matrix[2][0] +
                 (double)CONCAT44(local_f8.xp._4_4_,local_f8.xp._0_4_);
            xform.m_matrix[0][1] =
                 (pQVar15->sceneTransform).m_matrix[2][1] +
                 (double)CONCAT44(local_f8.yp._4_4_,local_f8.yp._0_4_);
            xform.m_matrix[0][2] = (qreal)CONCAT44(local_f8.w._4_4_,local_f8.w._0_4_);
            xform.m_matrix[1][0] = (qreal)CONCAT44(local_f8.h._4_4_,local_f8.h._0_4_);
          }
          QGraphicsScene::update(this_00,(QRectF *)&xform);
          goto LAB_005928e0;
        }
      }
    }
    local_118.w = 0.0;
    local_118.h = 0.0;
    local_118.xp = 0.0;
    local_118.yp = 0.0;
    ppQVar4 = (this->views).d.ptr;
    lVar23 = (this->views).d.size;
    bVar24 = true;
    for (lVar21 = 0; lVar23 << 3 != lVar21; lVar21 = lVar21 + 8) {
      this_01 = *(QGraphicsViewPrivate **)(*(long *)((long)ppQVar4 + lVar21) + 8);
      this_03 = QHash<QWidget_*,_QRect>::operator[]
                          (&((item->d_ptr).d)->paintedViewBoundingRects,
                           &(this_01->super_QAbstractScrollAreaPrivate).viewport);
      if (((this_01->field_0x301 & 0x10) == 0) && (this_01->viewportUpdateMode != NoViewportUpdate))
      {
        if ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000000000000) != 0) {
          QRect::translate(this_03,&this_01->dirtyScrollOffset);
          bVar10 = QGraphicsViewPrivate::updateRect(this_01,this_03);
          if (!bVar10) {
            this_03->x1 = -1;
            this_03->y1 = -1;
            this_03->x2 = -3;
            this_03->y2 = -3;
          }
        }
        pQVar15 = (item->d_ptr).d;
        uVar27 = *(ulong *)&pQVar15->field_0x160;
        uVar12 = (uint)uVar27;
        if (((uVar12 >> 0x19 & 1) != 0) &&
           (((uVar27 & 0x10000000000000) != 0 ||
            (auVar29._0_4_ = -(uint)((this_03->x1).m_i == -1),
            auVar29._4_4_ = -(uint)((this_03->y1).m_i == -1),
            auVar29._8_4_ = -(uint)((this_03->x2).m_i == -3),
            auVar29._12_4_ = -(uint)((this_03->y2).m_i == -3), uVar16 = movmskps(0,auVar29),
            (char)uVar16 != '\x0f')))) {
          if (bVar24) {
            local_118.xp = (qreal)CONCAT44(local_f8.xp._4_4_,local_f8.xp._0_4_);
            local_118.yp = (qreal)CONCAT44(local_f8.yp._4_4_,local_f8.yp._0_4_);
            local_118.w = (qreal)CONCAT44(local_f8.w._4_4_,local_f8.w._0_4_);
            local_118.h = (qreal)CONCAT44(local_f8.h._4_4_,local_f8.h._0_4_);
            if (-1 < (int)uVar12) {
              _q_adjustRect(&pQVar15->needsRepaint);
              QRectF::operator&=(&local_118,&((item->d_ptr).d)->needsRepaint);
            }
          }
          bVar24 = false;
          if ((0.0 < local_118.w) && (0.0 < local_118.h)) {
            pQVar15 = (item->d_ptr).d;
            this_02 = *(QGraphicsView **)
                       &(this_01->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8;
            if ((uVar22 & 0x2000040000) == 0) {
              if (((pQVar15->field_0x167 & 0x40) == 0) || ((this_01->field_0x300 & 0x10) == 0)) {
                bVar24 = QGraphicsView::isTransformed(this_02);
                if (bVar24) {
                  pQVar18 = &pQVar15->sceneTransform;
                  pQVar20 = (QRectF *)&xform;
                  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                    (*(qreal (*) [3])&pQVar20->xp)[0] = pQVar18->m_matrix[0][0];
                    pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar26 * -0x10 + 8);
                    pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar26 * -0x10 + 8);
                  }
                  QGraphicsView::viewportTransform(&local_d8,this_02);
                  QTransform::operator*=(&xform,&local_d8);
                  goto LAB_00592728;
                }
                if ((pQVar15->field_0x162 & 0x80) == 0) {
                  QTransform::mapRect((QRectF *)&xform);
                  pQVar20 = (QRectF *)&xform;
                  goto LAB_0059275b;
                }
                pQVar18 = &pQVar15->sceneTransform;
                goto LAB_00592772;
              }
              xform.m_matrix[0][2] = local_118.w;
              xform.m_matrix[1][0] = local_118.h;
              xform.m_matrix[0][0] = local_118.xp;
              xform.m_matrix[0][1] = local_118.yp;
              dVar8 = (pQVar15->sceneTransform).m_matrix[2][0];
              dVar9 = (pQVar15->sceneTransform).m_matrix[2][1];
              qVar13 = QGraphicsViewPrivate::horizontalScroll(this_01);
              qVar14 = QGraphicsViewPrivate::verticalScroll(this_01);
              xform.m_matrix[0][0] = (dVar8 - (double)qVar13) + xform.m_matrix[0][0];
              xform.m_matrix[0][1] = (dVar9 - (double)qVar14) + xform.m_matrix[0][1];
              pQVar20 = (QRectF *)&xform;
LAB_0059275b:
              bVar24 = QGraphicsViewPrivate::updateRectF(this_01,pQVar20);
            }
            else {
              pQVar5 = pQVar15->q_ptr;
              pqVar19 = (qreal *)&DAT_006795c0;
              pQVar20 = (QRectF *)&xform;
              for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                (*(qreal (*) [3])&pQVar20->xp)[0] = *pqVar19;
                pqVar19 = pqVar19 + (ulong)bVar26 * -2 + 1;
                pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar26 * -0x10 + 8);
              }
              QGraphicsView::viewportTransform(&local_d8,this_02);
              QGraphicsItem::deviceTransform(&xform,pQVar5,&local_d8);
LAB_00592728:
              if ((pQVar15->field_0x162 & 0x80) == 0) {
                QTransform::mapRect((QRectF *)&local_d8);
                pQVar20 = (QRectF *)&local_d8;
                goto LAB_0059275b;
              }
              pQVar18 = &xform;
LAB_00592772:
              bVar24 = QGraphicsViewPrivate::updateRegion(this_01,&local_118,pQVar18);
            }
            if (bVar24 == false) {
              bVar24 = false;
              if ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000000000000) != 0)
              goto LAB_005925c1;
            }
            else {
              bVar24 = false;
            }
          }
        }
      }
      else {
LAB_005925c1:
        this_03->x1 = -1;
        this_03->y1 = -1;
        this_03->x2 = -3;
        this_03->y2 = -3;
      }
    }
  }
LAB_005928e0:
  if (lVar3 == 0) {
LAB_005928ff:
    if ((uVar22 & 0x20000000000000) != 0) {
      QGraphicsItemPrivate::invalidateChildrenSceneTransform((item->d_ptr).d);
    }
  }
  else {
    pQVar15 = (item->d_ptr).d;
    uVar27 = *(ulong *)&pQVar15->field_0x160;
    if (((uint)uVar27 >> 0x1a & 1) == 0) goto LAB_005928ff;
    if (((uVar27 & 0x8001000000000) != 0) && (bVar25 || (local_158 & 0x10000000000000) == 0)) {
      ppQVar4 = (this->views).d.ptr;
      lVar3 = (this->views).d.size;
      for (lVar23 = 0; lVar3 << 3 != lVar23; lVar23 = lVar23 + 8) {
        QGraphicsViewPrivate::setUpdateClip
                  (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar4 + lVar23) + 8),item);
      }
      pQVar15 = (item->d_ptr).d;
    }
    uVar6 = *(ulong *)&pQVar15->field_0x160;
    ppQVar7 = (pQVar15->children).d.ptr;
    lVar3 = (pQVar15->children).d.size;
    for (lVar23 = 0; lVar3 << 3 != lVar23; lVar23 = lVar23 + 8) {
      pQVar5 = *(QGraphicsItem **)((long)ppQVar7 + lVar23);
      if ((uVar22 & 0x20000000000000) != 0) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
      }
      if ((local_158 & 0x10000000000000) != 0) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10000000000000;
      }
      if ((uVar6 & 0x200000000000000) != 0) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x200000000000000;
      }
      if ((uVar6 & 0x400000000000000) != 0) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000000000;
      }
      if (((uint)uVar6 >> 0x1e & 1) != 0) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x2000000;
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x80000000;
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x4000000;
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x40000000;
      }
      processDirtyItemsRecursive
                (this,pQVar5,
                 dirtyAncestorContainsChildren ||
                 (int)(uint)uVar6 < 0 && (uVar27 & 0x8001000000000) != 0,parentOpacity_00);
    }
    if ((uVar27 & 0x8001000000000) != 0) {
      ppQVar4 = (this->views).d.ptr;
      lVar3 = (this->views).d.size;
      for (lVar23 = 0; lVar3 << 3 != lVar23; lVar23 = lVar23 + 8) {
        QGraphicsViewPrivate::setUpdateClip
                  (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar4 + lVar23) + 8),
                   (QGraphicsItem *)0x0);
      }
    }
  }
  resetDirtyItem(this,item,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00592bd7:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::processDirtyItemsRecursive(QGraphicsItem *item, bool dirtyAncestorContainsChildren,
                                                       qreal parentOpacity)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(item);
    Q_ASSERT(!updateAll);

    if (!item->d_ptr->dirty && !item->d_ptr->dirtyChildren) {
        resetDirtyItem(item);
        return;
    }

    const bool itemIsHidden = !item->d_ptr->ignoreVisible && !item->d_ptr->visible;
    if (itemIsHidden) {
        resetDirtyItem(item, /*recursive=*/true);
        return;
    }

    bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents) {
        if (!itemHasChildren) {
            resetDirtyItem(item);
            return; // Item has neither contents nor children!(?)
        }
        if (item->d_ptr->graphicsEffect)
            itemHasContents = true;
    }

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = !item->d_ptr->ignoreOpacity
                                        && QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity())) {
        resetDirtyItem(item, /*recursive=*/itemHasChildren);
        return;
    }

    bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (wasDirtyParentSceneTransform && !itemIsUntransformable) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool wasDirtyParentViewBoundingRects = item->d_ptr->paintedViewBoundingRectsNeedRepaint;
    if (itemIsFullyTransparent || !itemHasContents || dirtyAncestorContainsChildren) {
        // Make sure we don't process invisible items or items with no content.
        item->d_ptr->dirty = 0;
        item->d_ptr->fullUpdatePending = 0;
        // Might have a dirty view bounding rect otherwise.
        if (itemIsFullyTransparent || !itemHasContents)
            item->d_ptr->paintedViewBoundingRectsNeedRepaint = 0;
    }

    if (!hasSceneRect && item->d_ptr->geometryChanged && item->d_ptr->visible) {
        // Update growingItemsBoundingRect.
        if (item->d_ptr->sceneTransformTranslateOnly) {
            growingItemsBoundingRect |= item->boundingRect().translated(item->d_ptr->sceneTransform.dx(),
                                                                        item->d_ptr->sceneTransform.dy());
        } else {
            growingItemsBoundingRect |= item->d_ptr->sceneTransform.mapRect(item->boundingRect());
        }
    }

    // Process item.
    if (item->d_ptr->dirty || item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
        const bool useCompatUpdate = views.isEmpty() || isSignalConnected(changedSignalIndex);
        const QRectF itemBoundingRect = adjustedItemEffectiveBoundingRect(item);

        if (useCompatUpdate && !itemIsUntransformable && qFuzzyIsNull(item->boundingRegionGranularity())) {
            // This block of code is kept for compatibility. Since 4.5, by default
            // QGraphicsView does not connect the signal and we use the below
            // method of delivering updates.
            if (item->d_ptr->sceneTransformTranslateOnly) {
                q->update(itemBoundingRect.translated(item->d_ptr->sceneTransform.dx(),
                                                      item->d_ptr->sceneTransform.dy()));
            } else {
                QRectF rect = item->d_ptr->sceneTransform.mapRect(itemBoundingRect);
                if (!rect.isEmpty())
                    q->update(rect);
            }
        } else {
            QRectF dirtyRect;
            bool uninitializedDirtyRect = true;

            for (auto view : std::as_const(views)) {
                QGraphicsViewPrivate *viewPrivate = view->d_func();
                QRect &paintedViewBoundingRect = item->d_ptr->paintedViewBoundingRects[viewPrivate->viewport];
                if (viewPrivate->fullUpdatePending
                    || viewPrivate->viewportUpdateMode == QGraphicsView::NoViewportUpdate) {
                    // Okay, if we have a full update pending or no viewport update, this item's
                    // paintedViewBoundingRect  will be updated correctly in the next paintEvent if
                    // it is inside the viewport, but for now we can pretend that it is outside.
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1);
                    continue;
                }

                if (item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect.translate(viewPrivate->dirtyScrollOffset);
                    if (!viewPrivate->updateRect(paintedViewBoundingRect))
                        paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }

                if (!item->d_ptr->dirty)
                    continue;

                if (!item->d_ptr->paintedViewBoundingRectsNeedRepaint
                    && paintedViewBoundingRect.x() == -1 && paintedViewBoundingRect.y() == -1
                    && paintedViewBoundingRect.width() == -1 && paintedViewBoundingRect.height() == -1) {
                    continue; // Outside viewport.
                }

                if (uninitializedDirtyRect) {
                    dirtyRect = itemBoundingRect;
                    if (!item->d_ptr->fullUpdatePending) {
                        _q_adjustRect(&item->d_ptr->needsRepaint);
                        dirtyRect &= item->d_ptr->needsRepaint;
                    }
                    uninitializedDirtyRect = false;
                }

                if (dirtyRect.isEmpty())
                    continue; // Discard updates outside the bounding rect.

                if (!updateHelper(viewPrivate, item->d_ptr.data(), dirtyRect, itemIsUntransformable)
                    && item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }
            }
        }
    }

    // Process children.
    if (itemHasChildren && item->d_ptr->dirtyChildren) {
        const bool itemClipsChildrenToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                              || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape;
        // Items with no content are threated as 'dummy' items which means they are never drawn and
        // 'processed', so the painted view bounding rect is never up-to-date. This means that whenever
        // such an item changes geometry, its children have to take care of the update regardless
        // of whether the item clips children to shape or not.
        const bool bypassUpdateClip = !itemHasContents && wasDirtyParentViewBoundingRects;
        if (itemClipsChildrenToShape && !bypassUpdateClip) {
            // Make sure child updates are clipped to the item's bounding rect.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(item);
        }
        if (!dirtyAncestorContainsChildren) {
            dirtyAncestorContainsChildren = item->d_ptr->fullUpdatePending
                                            && itemClipsChildrenToShape;
        }
        const bool allChildrenDirty = item->d_ptr->allChildrenDirty;
        const bool parentIgnoresVisible = item->d_ptr->ignoreVisible;
        const bool parentIgnoresOpacity = item->d_ptr->ignoreOpacity;
        for (auto child : std::as_const(item->d_ptr->children)) {
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (wasDirtyParentViewBoundingRects)
                child->d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
            if (parentIgnoresVisible)
                child->d_ptr->ignoreVisible = 1;
            if (parentIgnoresOpacity)
                child->d_ptr->ignoreOpacity = 1;
            if (allChildrenDirty) {
                child->d_ptr->dirty = 1;
                child->d_ptr->fullUpdatePending = 1;
                child->d_ptr->dirtyChildren = 1;
                child->d_ptr->allChildrenDirty = 1;
            }
            processDirtyItemsRecursive(child, dirtyAncestorContainsChildren, opacity);
        }

        if (itemClipsChildrenToShape) {
            // Reset updateClip.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(nullptr);
        }
    } else if (wasDirtyParentSceneTransform) {
        item->d_ptr->invalidateChildrenSceneTransform();
    }

    resetDirtyItem(item);
}